

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::scrape_failed_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,scrape_failed_alert *this)

{
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  tracker_alert::message_abi_cxx11_(&local_38,&this->super_tracker_alert);
  std::operator+(&bStack_58,&local_38," scrape failed: ");
  __rhs = error_message(this);
  std::operator+(__return_storage_ptr__,&bStack_58,__rhs);
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string scrape_failed_alert::message() const
	{
		return tracker_alert::message() + " scrape failed: " + error_message();
	}